

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O1

int __thiscall ImGuiWS::init(ImGuiWS *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  int iVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  function<void_()> *in_R8;
  function<void_()> *in_R9;
  long *local_68;
  long local_58;
  long lStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::function<void_()>::operator=
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->handlerConnect,in_R8);
  std::function<void_()>::operator=
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->handlerDisconnect,in_R9)
  ;
  plVar1 = in_RDX + 2;
  if ((long *)*in_RDX == plVar1) {
    local_58 = *plVar1;
    lStack_50 = in_RDX[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar1;
    local_68 = (long *)*in_RDX;
  }
  *in_RDX = (long)plVar1;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)*in_RCX;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX[1];
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_RCX[2];
  in_RCX[2] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  iVar2 = init(this,(EVP_PKEY_CTX *)((ulong)ctx & 0xffffffff));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  return iVar2;
}

Assistant:

bool ImGuiWS::init(int32_t port, std::string pathHttp, std::vector<std::string> resources, THandler && handlerConnect, THandler && handlerDisconnect) {
    m_impl->handlerConnect = std::move(handlerConnect);
    m_impl->handlerDisconnect = std::move(handlerDisconnect);

    return init(port, std::move(pathHttp), std::move(resources));
}